

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_date(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  char *local_2160;
  char local_2158 [8];
  char buff [200];
  size_t reslen;
  luaL_Buffer b;
  tm *ptStack_60;
  char cc [4];
  tm *stm;
  tm tmr;
  time_t t;
  char *s;
  lua_State *L_local;
  
  t = (time_t)luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    local_2160 = (char *)time((time_t *)0x0);
  }
  else {
    lVar2 = luaL_checknumber(L,2);
    local_2160 = (char *)(long)lVar2;
  }
  tmr.tm_zone = local_2160;
  if (*(char *)t == '!') {
    ptStack_60 = gmtime((time_t *)&tmr.tm_zone);
    t = t + 1;
  }
  else {
    ptStack_60 = localtime((time_t *)&tmr.tm_zone);
  }
  if (ptStack_60 == (tm *)0x0) {
    lua_pushnil(L);
  }
  else {
    iVar1 = strcmp((char *)t,"*t");
    if (iVar1 == 0) {
      lua_createtable(L,0,9);
      setfield(L,"sec",ptStack_60->tm_sec);
      setfield(L,"min",ptStack_60->tm_min);
      setfield(L,"hour",ptStack_60->tm_hour);
      setfield(L,"day",ptStack_60->tm_mday);
      setfield(L,"month",ptStack_60->tm_mon + 1);
      setfield(L,"year",ptStack_60->tm_year + 0x76c);
      setfield(L,"wday",ptStack_60->tm_wday + 1);
      setfield(L,"yday",ptStack_60->tm_yday + 1);
      setboolfield(L,"isdst",ptStack_60->tm_isdst);
    }
    else {
      b.initb[0x1ffc] = '%';
      luaL_buffinit(L,(luaL_Buffer *)&reslen);
      while (*(char *)t != '\0') {
        if (*(char *)t == '%') {
          t = (time_t)checkoption(L,(char *)(t + 1),b.initb + 0x1ffc);
          buff._192_8_ = strftime(local_2158,200,b.initb + 0x1ffc,ptStack_60);
          luaL_addlstring((luaL_Buffer *)&reslen,local_2158,buff._192_8_);
        }
        else {
          if (b.b <= b.size) {
            luaL_prepbuffsize((luaL_Buffer *)&reslen,1);
          }
          *(undefined1 *)(reslen + b.size) = *(undefined1 *)t;
          b.size = b.size + 1;
          t = t + 1;
        }
      }
      luaL_pushresult((luaL_Buffer *)&reslen);
    }
  }
  return 1;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip `!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    lua_pushnil(L);
  else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  }
  else {
    char cc[4];
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* no conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char buff[200];  /* should be big enough for any conversion result */
        s = checkoption(L, s + 1, cc);
        reslen = strftime(buff, sizeof(buff), cc, stm);
        luaL_addlstring(&b, buff, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}